

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::ByteSizeLong
          (EnumDescriptorProto_EnumReservedRange *this)

{
  uint uVar1;
  int32_t iVar2;
  uint32_t *puVar3;
  size_t sVar4;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  EnumDescriptorProto_EnumReservedRange *this_;
  EnumDescriptorProto_EnumReservedRange *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      iVar2 = _internal_start(this);
      sStack_58 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
    }
    if ((uVar1 & 2) != 0) {
      iVar2 = _internal_end(this);
      sVar4 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t EnumDescriptorProto_EnumReservedRange::ByteSizeLong() const {
  const EnumDescriptorProto_EnumReservedRange& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumDescriptorProto.EnumReservedRange)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional int32 start = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_start());
    }
    // optional int32 end = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_end());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}